

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qipaddress.cpp
# Opt level: O1

void QIPAddressUtils::toString(QString *appendTo,IPv4Address address)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char16_t *__old_val_4;
  QTypedArrayData<char16_t> *__old_val_3;
  longlong __old_val_11;
  QTypedArrayData<char16_t> *__old_val_6;
  char16_t *__old_val_7;
  longlong __old_val_8;
  char16_t *__old_val_1;
  QTypedArrayData<char16_t> *__old_val;
  long in_FS_OFFSET;
  QStringView zero;
  QStringView zero_00;
  QStringView zero_01;
  QStringView zero_02;
  QString local_248;
  QString local_230;
  QString local_218;
  QString local_200;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_1e8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> local_1b0;
  char16_t local_178;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  local_170;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  local_118;
  char16_t local_c0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (address < 0x1000000) {
    local_200.d.d = (Data *)0x0;
    local_200.d.ptr = L"0";
    local_200.d.size = 1;
  }
  else {
    zero.m_data = L"0";
    zero.m_size = 1;
    qulltoa(&local_200,(ulong)(address >> 0x18),10,zero);
  }
  qVar3 = local_200.d.size;
  pcVar2 = local_200.d.ptr;
  pDVar1 = local_200.d.d;
  local_200.d.d = (Data *)0x0;
  local_200.d.ptr = (char16_t *)0x0;
  local_200.d.size = 0;
  if ((address & 0xff0000) == 0) {
    local_218.d.d = (Data *)0x0;
    local_218.d.ptr = L"0";
    local_218.d.size = 1;
  }
  else {
    zero_00.m_data = L"0";
    zero_00.m_size = 1;
    qulltoa(&local_218,(ulong)(address >> 0x10) & 0xff,10,zero_00);
  }
  local_1b0.b.d.size = local_218.d.size;
  local_1b0.b.d.ptr = local_218.d.ptr;
  local_1b0.b.d.d = local_218.d.d;
  local_1e8.a.b = L'.';
  local_218.d.d = (Data *)0x0;
  local_218.d.ptr = (char16_t *)0x0;
  local_218.d.size = 0;
  local_1e8.a.a.d.d = (Data *)0x0;
  local_1b0.a.a.d.d = pDVar1;
  local_1e8.a.a.d.ptr = (char16_t *)0x0;
  local_1e8.a.a.d.size = 0;
  local_1b0.a.a.d.ptr = pcVar2;
  local_1b0.a.a.d.size = qVar3;
  local_1b0.a.b = L'.';
  local_1e8.b.d.d = (Data *)0x0;
  local_1e8.b.d.ptr = (char16_t *)0x0;
  local_1e8.b.d.size = 0;
  local_178 = L'.';
  if ((address & 0xff00) == 0) {
    local_230.d.d = (Data *)0x0;
    local_230.d.ptr = L"0";
    local_230.d.size = 1;
  }
  else {
    zero_01.m_data = L"0";
    zero_01.m_size = 1;
    qulltoa(&local_230,(ulong)(address >> 8) & 0xff,10,zero_01);
  }
  local_118.a.a.b.d.size = local_1b0.b.d.size;
  local_118.a.a.b.d.ptr = local_1b0.b.d.ptr;
  local_118.a.a.b.d.d = local_1b0.b.d.d;
  local_118.a.a.a.a.d.size = local_1b0.a.a.d.size;
  local_118.a.a.a.a.d.ptr = local_1b0.a.a.d.ptr;
  local_118.a.a.a.a.d.d = local_1b0.a.a.d.d;
  local_118.b.d.size = local_230.d.size;
  local_118.b.d.ptr = local_230.d.ptr;
  local_118.b.d.d = local_230.d.d;
  local_1b0.a.a.d.d = (Data *)0x0;
  local_1b0.a.a.d.ptr = (char16_t *)0x0;
  local_1b0.a.a.d.size = 0;
  local_170.a.a.a.b = local_1b0.a.b;
  local_1b0.b.d.d = (Data *)0x0;
  local_1b0.b.d.ptr = (char16_t *)0x0;
  local_1b0.b.d.size = 0;
  local_170.a.b = local_178;
  local_230.d.d = (Data *)0x0;
  local_230.d.ptr = (char16_t *)0x0;
  local_230.d.size = 0;
  local_170.a.a.a.a.d.d = (Data *)0x0;
  local_170.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_170.a.a.a.a.d.size = 0;
  local_118.a.a.a.b = local_1b0.a.b;
  local_170.a.a.b.d.d = (Data *)0x0;
  local_170.a.a.b.d.ptr = (char16_t *)0x0;
  local_170.a.a.b.d.size = 0;
  local_118.a.b = local_178;
  local_170.b.d.d = (Data *)0x0;
  local_170.b.d.ptr = (char16_t *)0x0;
  local_170.b.d.size = 0;
  local_c0 = L'.';
  if ((char)address == '\0') {
    local_248.d.d = (Data *)0x0;
    local_248.d.ptr = L"0";
    local_248.d.size = 1;
  }
  else {
    zero_02.m_data = L"0";
    zero_02.m_size = 1;
    qulltoa(&local_248,(ulong)address & 0xff,10,zero_02);
  }
  local_b8.a.a.b.d.size = local_118.b.d.size;
  local_b8.a.a.b.d.ptr = local_118.b.d.ptr;
  local_b8.a.a.b.d.d = local_118.b.d.d;
  local_b8.a.a.a.a.b.d.size = local_118.a.a.b.d.size;
  local_b8.a.a.a.a.b.d.ptr = local_118.a.a.b.d.ptr;
  local_b8.a.a.a.a.b.d.d = local_118.a.a.b.d.d;
  local_b8.a.a.a.a.a.a.d.size = local_118.a.a.a.a.d.size;
  local_b8.a.a.a.a.a.a.d.ptr = local_118.a.a.a.a.d.ptr;
  local_b8.a.a.a.a.a.a.d.d = local_118.a.a.a.a.d.d;
  local_b8.b.d.size = local_248.d.size;
  local_b8.b.d.ptr = local_248.d.ptr;
  local_b8.b.d.d = local_248.d.d;
  local_118.a.a.a.a.d.d = (Data *)0x0;
  local_118.a.a.a.a.d.ptr = (char16_t *)0x0;
  local_118.a.a.a.a.d.size = 0;
  local_b8.a.a.a.a.a.b = local_118.a.a.a.b;
  local_118.a.a.b.d.d = (Data *)0x0;
  local_118.a.a.b.d.ptr = (char16_t *)0x0;
  local_118.a.a.b.d.size = 0;
  local_b8.a.a.a.b = local_118.a.b;
  local_118.b.d.d = (Data *)0x0;
  local_118.b.d.ptr = (char16_t *)0x0;
  local_118.b.d.size = 0;
  local_b8.a.b = local_c0;
  local_248.d.d = (Data *)0x0;
  local_248.d.ptr = (char16_t *)0x0;
  local_248.d.size = 0;
  ::operator+=(appendTo,&local_b8);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_b8);
  if (&(local_248.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_248.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_248.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_118);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>,_char16_t>,_QString>
  ::~QStringBuilder(&local_170);
  if (&(local_230.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_230.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_230.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_230.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_230.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_1b0);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder(&local_1e8);
  if (&(local_218.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_218.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_218.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_200.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_200.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_200.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void toString(QString &appendTo, IPv4Address address)
{
    // reconstructing is easy
    // use the fast operator% that pre-calculates the size
    appendTo += number(address >> 24) % u'.'
                % number(address >> 16) % u'.'
                % number(address >> 8) % u'.'
                % number(address);
}